

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

Error __thiscall argstest::Command::GetError(Command *this)

{
  int iVar1;
  Error EVar2;
  
  iVar1 = (*(this->super_Group).super_Base._vptr_Base[2])();
  EVar2 = None;
  if ((((char)iVar1 != '\0') && (EVar2 = (this->super_Group).super_Base.error, EVar2 == None)) &&
     (EVar2 = this->subparserError, EVar2 == None)) {
    EVar2 = Group::GetError(&this->super_Group);
    return EVar2;
  }
  return EVar2;
}

Assistant:

virtual Error GetError() const override
            {
                if (!Matched())
                {
                    return Error::None;
                }

                if (error != Error::None)
                {
                    return error;
                }

                if (subparserError != Error::None)
                {
                    return subparserError;
                }

                return Group::GetError();
            }